

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O3

bool __thiscall
ON_ModelComponent::Internal_SetAsSystemComponent(ON_ModelComponent *this,bool bUnsetSystemComponent)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Type TVar4;
  byte bVar5;
  uint uVar6;
  ON_NameHash *this_00;
  
  if (this->m_locked_status == 0xffff) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x30f,"","component is already a system component.");
LAB_0053239c:
    bVar3 = true;
  }
  else {
    TVar4 = this->m_component_type;
    uVar6 = (uint)TVar4;
    if (TVar4 < 0x12) {
      if ((0x3cffeU >> (TVar4 & 0x1f) & 1) == 0) {
        if ((0x3000U >> (TVar4 & 0x1f) & 1) == 0) goto LAB_00532467;
        goto LAB_0053248b;
      }
      bVar3 = false;
    }
    else {
LAB_00532467:
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x7c4,"","Invalid component_type parameter.");
      uVar6 = (uint)this->m_component_type;
LAB_0053248b:
      bVar3 = true;
    }
    TVar4 = (Type)uVar6;
    if (TVar4 < NumOf) {
      if ((0x28df0U >> (uVar6 & 0x1f) & 1) == 0) {
        if ((0x720eU >> (uVar6 & 0x1f) & 1) == 0) goto LAB_005324df;
        goto LAB_005323b1;
      }
      bVar1 = false;
    }
    else {
LAB_005324df:
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x807,"","Invalid component_type parameter.");
      TVar4 = this->m_component_type;
LAB_005323b1:
      bVar1 = true;
    }
    bVar5 = TVar4 - Image;
    if ((bVar5 < 0x11) && ((0x17fffU >> (bVar5 & 0x1f) & 1) != 0)) {
      bVar5 = (byte)(0x8010 >> (bVar5 & 0x1f));
    }
    else {
      bVar5 = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
                 ,0x7e5,"","Invalid component_type parameter.");
    }
    bVar2 = ::operator==(&ON_nil_uuid,&this->m_component_parent_id);
    if (((bVar2) && (((bVar5 ^ (byte)this->m_set_status >> 6) & 1) == 0)) &&
       (bVar2 = ::operator==(&ON_nil_uuid,&this->m_component_id), bVar2 == bUnsetSystemComponent)) {
      if (bVar3 || bUnsetSystemComponent) {
        if ((this->m_set_status & 0x10) == 0) {
LAB_005324af:
          bVar3 = ON_ComponentStatus::operator!=(&this->m_component_status,this->m_component_status)
          ;
          if (!bVar3) {
            if (bVar1 || bUnsetSystemComponent) {
              if ((this->m_set_status & 0x20) != 0) {
                return false;
              }
              bVar3 = ON_NameHash::IsEmptyNameHash(&ON_NameHash::EmptyNameHash);
            }
            else {
              if (((this->m_set_status & 0x20) == 0) ||
                 (bVar3 = ON_wString::IsNotEmpty(&this->m_component_name), !bVar3))
              goto LAB_0053242f;
              if ((this->m_set_status & 0x20) == 0) {
                this_00 = &ON_NameHash::EmptyNameHash;
              }
              else {
                this_00 = Internal_NameHash(this);
              }
              bVar3 = ON_NameHash::IsValidAndNotEmpty(this_00);
            }
            if (bVar3 != false) {
              this->m_locked_status = 0xffff;
              this->m_content_version_number = 0;
              goto LAB_0053239c;
            }
          }
        }
      }
      else if (((this->m_set_status & 0x10) != 0) && (0x80000001 < (uint)this->m_component_index))
      goto LAB_005324af;
    }
LAB_0053242f:
    bVar3 = false;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x350,"","Invalid settings for a system component.");
  }
  return bVar3;
}

Assistant:

bool ON_ModelComponent::Internal_SetAsSystemComponent(
  bool bUnsetSystemComponent
  )
{
  if (m_locked_status == 0xFFFFU)
  {
    ON_ERROR("component is already a system component.");
    return true;
  }

  const bool bIndexRequired = ON_ModelComponent::IndexRequired(m_component_type);
  const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(m_component_type);
  const bool bUniqueNameIncludesParent = ON_ModelComponent::UniqueNameIncludesParent(m_component_type);

  for (;;)
  {
    if (ParentIdIsNotNil())
      break;

    if (bUniqueNameIncludesParent != ParentIdIsSet())
      break;
    
    if (IdIsNil())
    {
      if (!bUnsetSystemComponent)
        break;
    }
    else
    {
      if (bUnsetSystemComponent)
        break;
    }
    
    if ( bIndexRequired && false == bUnsetSystemComponent )
    {
      if (false == IndexIsSet())
        break;
      if (Index() >= 0)
        break;
      if (Index() <= ON_UNSET_INT_INDEX)
        break;
    }
    else
    {
      if (IndexIsSet())
        break;
    }
    
    if ( ON_ModelComponent::m_component_status != m_component_status ) 
      break;

    if (bUniqueNameRequired && false == bUnsetSystemComponent)
    {
      if (false == NameIsNotEmpty())
        break;
      if (false == NameHash().IsValidAndNotEmpty())
        break;
    }
    else
    {
      if (NameIsSet())
        return false;
      if (false == NameHash().IsEmptyNameHash())
        break;
    }

    m_locked_status = 0xFFFFU;
    m_content_version_number = 0;
    return true;
  }

  ON_ERROR("Invalid settings for a system component.");
  return false;
}